

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O1

void av1_alloc_cdef_buffers
               (AV1_COMMON *cm,AV1CdefWorkerData **cdef_worker,AV1CdefSync *cdef_sync,
               int num_workers,int init_worker)

{
  size_t *psVar1;
  int iVar2;
  uint uVar3;
  SequenceHeader *pSVar4;
  pthread_mutex_t *__mutex;
  pthread_cond_t *__cond;
  bool bVar5;
  uint16_t *puVar6;
  AV1CdefWorkerData *pAVar7;
  void *pvVar8;
  AV1CdefRowSync *pAVar9;
  byte bVar10;
  int plane_3;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  int plane_2;
  long lVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  int plane_1;
  long lVar18;
  size_t new_colbuf_size [3];
  size_t new_linebuf_size [3];
  size_t local_b0;
  size_t local_78 [4];
  size_t local_58 [3];
  size_t *local_40;
  ulong local_38;
  
  pSVar4 = cm->seq_params;
  local_38 = 0;
  local_58[2] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_78[2] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  iVar2 = (cm->mi_params).mi_rows;
  iVar16 = iVar2 + 0xf;
  iVar2 = iVar2 + 0x1e;
  if (-1 < iVar16) {
    iVar2 = iVar16;
  }
  uVar12 = iVar2 >> 4;
  if (pSVar4->enable_cdef != '\0') {
    local_38 = (ulong)((cm->tiles).single_tile_decoding == 0);
  }
  lVar18 = 0x60;
  if (1 < num_workers) {
    lVar18 = (long)(int)uVar12 << 5;
  }
  uVar13 = (ulong)((uint)(pSVar4->monochrome == '\0') * 2 + 1);
  if ((char)local_38 == '\0') {
    local_b0 = 0;
  }
  else {
    iVar16 = (cm->mi_params).mi_cols;
    uVar11 = 0;
    do {
      bVar10 = 0;
      if (uVar11 != 0) {
        bVar10 = (byte)pSVar4->subsampling_x;
      }
      local_58[uVar11] = ((int)(iVar16 * 4 + 0xfU & 0xfffffff0) >> (bVar10 & 0x1f)) * lVar18;
      local_78[uVar11] = (long)(0x100 << (2 - bVar10 & 0x1f)) << 4;
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
    local_b0 = 0x9480;
  }
  iVar16 = (cm->cdef_info).allocated_num_workers;
  local_40 = (cm->cdef_info).allocated_linebuf_size;
  lVar18 = 0;
  do {
    if (local_58[lVar18] != (cm->cdef_info).allocated_linebuf_size[lVar18]) {
      aom_free((cm->cdef_info).linebuf[lVar18]);
      (cm->cdef_info).linebuf[lVar18] = (uint16_t *)0x0;
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  if ((cm->cdef_info).allocated_srcbuf_size != local_b0) {
    aom_free((cm->cdef_info).srcbuf);
    (cm->cdef_info).srcbuf = (uint16_t *)0x0;
  }
  psVar1 = (cm->cdef_info).allocated_colbuf_size;
  lVar18 = 0;
  do {
    if (local_78[lVar18] != (cm->cdef_info).allocated_colbuf_size[lVar18]) {
      aom_free((cm->cdef_info).colbuf[lVar18]);
      (cm->cdef_info).colbuf[lVar18] = (uint16_t *)0x0;
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  if ((init_worker != 0) && (*cdef_worker != (AV1CdefWorkerData *)0x0)) {
    if (iVar16 == num_workers) {
      if (1 < num_workers) {
        lVar18 = (ulong)(uint)num_workers * 0x1f8 + -0x1e8;
        uVar11 = (ulong)(uint)num_workers;
        do {
          uVar15 = uVar11 - 1;
          pAVar7 = *cdef_worker;
          if ((cm->cdef_info).allocated_srcbuf_size != local_b0) {
            aom_free(pAVar7[uVar15].srcbuf);
            pAVar7[uVar15].srcbuf = (uint16_t *)0x0;
          }
          lVar14 = 0;
          do {
            if (local_78[lVar14] != psVar1[lVar14]) {
              aom_free(*(void **)((long)pAVar7->colbuf + lVar14 * 8 + lVar18 + -0x10));
              *(undefined8 *)((long)pAVar7->colbuf + lVar14 * 8 + lVar18 + -0x10) = 0;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          lVar18 = lVar18 + -0x1f8;
          bVar5 = 2 < (long)uVar11;
          uVar11 = uVar15;
        } while (bVar5);
      }
    }
    else {
      lVar18 = (long)(cm->cdef_info).allocated_num_workers;
      if (1 < lVar18) {
        lVar14 = lVar18 * 0x1f8 + -0x1e8;
        do {
          pAVar7 = *cdef_worker;
          aom_free(pAVar7[lVar18 + -1].srcbuf);
          pAVar7[lVar18 + -1].srcbuf = (uint16_t *)0x0;
          lVar17 = 0;
          do {
            aom_free(*(void **)((long)pAVar7->colbuf + lVar17 * 8 + lVar14 + -0x10));
            *(undefined8 *)((long)pAVar7->colbuf + lVar17 * 8 + lVar14 + -0x10) = 0;
            lVar17 = lVar17 + 1;
          } while (lVar17 != 3);
          lVar14 = lVar14 + -0x1f8;
          bVar5 = 2 < lVar18;
          lVar18 = lVar18 + -1;
        } while (bVar5);
      }
      aom_free(*cdef_worker);
      *cdef_worker = (AV1CdefWorkerData *)0x0;
    }
  }
  uVar3 = (cm->cdef_info).allocated_mi_rows;
  if ((uVar3 != uVar12) && (cdef_sync->cdef_row_mt != (AV1CdefRowSync *)0x0)) {
    if (0 < (int)uVar3) {
      lVar18 = 0;
      do {
        __mutex = *(pthread_mutex_t **)((long)&cdef_sync->cdef_row_mt->row_mutex_ + lVar18);
        if (__mutex != (pthread_mutex_t *)0x0) {
          pthread_mutex_destroy(__mutex);
          aom_free(*(void **)((long)&cdef_sync->cdef_row_mt->row_mutex_ + lVar18));
        }
        __cond = *(pthread_cond_t **)((long)&cdef_sync->cdef_row_mt->row_cond_ + lVar18);
        if (__cond != (pthread_cond_t *)0x0) {
          pthread_cond_destroy(__cond);
          aom_free(*(void **)((long)&cdef_sync->cdef_row_mt->row_cond_ + lVar18));
        }
        lVar18 = lVar18 + 0x18;
      } while ((ulong)uVar3 * 0x18 != lVar18);
    }
    aom_free(cdef_sync->cdef_row_mt);
    cdef_sync->cdef_row_mt = (AV1CdefRowSync *)0x0;
  }
  (cm->cdef_info).allocated_srcbuf_size = local_b0;
  (cm->cdef_info).allocated_colbuf_size[2] = local_78[2];
  *psVar1 = local_78[0];
  (cm->cdef_info).allocated_colbuf_size[1] = local_78[1];
  local_40[2] = local_58[2];
  *local_40 = local_58[0];
  local_40[1] = local_58[1];
  (cm->cdef_info).allocated_mi_rows = uVar12;
  (cm->cdef_info).allocated_num_workers = num_workers;
  if ((char)local_38 != '\0') {
    if ((cm->cdef_info).srcbuf == (uint16_t *)0x0) {
      puVar6 = (uint16_t *)aom_memalign(0x10,local_b0);
      (cm->cdef_info).srcbuf = puVar6;
      if (puVar6 == (uint16_t *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate *srcbuf");
      }
    }
    uVar11 = 0;
    do {
      if ((cm->cdef_info).colbuf[uVar11] == (uint16_t *)0x0) {
        puVar6 = (uint16_t *)aom_malloc((cm->cdef_info).allocated_colbuf_size[uVar11]);
        (cm->cdef_info).colbuf[uVar11] = puVar6;
        if (puVar6 == (uint16_t *)0x0) {
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate colbuf[plane]");
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
    uVar11 = 0;
    do {
      if ((cm->cdef_info).linebuf[uVar11] == (uint16_t *)0x0) {
        puVar6 = (uint16_t *)aom_malloc((cm->cdef_info).allocated_linebuf_size[uVar11]);
        (cm->cdef_info).linebuf[uVar11] = puVar6;
        if (puVar6 == (uint16_t *)0x0) {
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate linebuf[plane]");
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar13 != uVar11);
    if (1 < num_workers) {
      if (init_worker != 0) {
        if (*cdef_worker == (AV1CdefWorkerData *)0x0) {
          pAVar7 = (AV1CdefWorkerData *)aom_calloc((ulong)(uint)num_workers,0x1f8);
          *cdef_worker = pAVar7;
          if (pAVar7 == (AV1CdefWorkerData *)0x0) {
            aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate *cdef_worker");
          }
        }
        lVar18 = (ulong)(num_workers - 1) * 0x1f8 + 0x10;
        uVar11 = (ulong)(uint)num_workers;
        do {
          pAVar7 = *cdef_worker;
          uVar15 = uVar11 - 1 & 0xffffffff;
          if (pAVar7[uVar15].srcbuf == (uint16_t *)0x0) {
            puVar6 = (uint16_t *)aom_memalign(0x10,(cm->cdef_info).allocated_srcbuf_size);
            pAVar7[uVar15].srcbuf = puVar6;
            if (puVar6 == (uint16_t *)0x0) {
              aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate *srcbuf");
            }
          }
          uVar15 = 0;
          do {
            if (*(long *)((long)pAVar7->colbuf + uVar15 * 8 + lVar18 + -0x10) == 0) {
              pvVar8 = aom_malloc(psVar1[uVar15]);
              *(void **)((long)pAVar7->colbuf + uVar15 * 8 + lVar18 + -0x10) = pvVar8;
              if (pvVar8 == (void *)0x0) {
                aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate colbuf[plane]")
                ;
              }
            }
            uVar15 = uVar15 + 1;
          } while (uVar13 != uVar15);
          lVar18 = lVar18 + -0x1f8;
          iVar16 = (int)uVar11;
          uVar11 = uVar11 - 1;
        } while (2 < iVar16);
      }
      if (cdef_sync->cdef_row_mt == (AV1CdefRowSync *)0x0) {
        iVar16 = (cm->cdef_info).allocated_mi_rows;
        pAVar9 = (AV1CdefRowSync *)aom_calloc((long)iVar16,0x18);
        cdef_sync->cdef_row_mt = pAVar9;
        if (pAVar9 == (AV1CdefRowSync *)0x0) {
          aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate *cdef_row_mt");
        }
        if (0 < iVar16) {
          lVar18 = 0;
          do {
            pvVar8 = aom_malloc(0x28);
            *(void **)((long)&cdef_sync->cdef_row_mt->row_mutex_ + lVar18) = pvVar8;
            if (*(long *)((long)&cdef_sync->cdef_row_mt->row_mutex_ + lVar18) == 0) {
              aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate (*cdef_row_mt)[row_idx].row_mutex_");
            }
            pthread_mutex_init(*(pthread_mutex_t **)
                                ((long)&cdef_sync->cdef_row_mt->row_mutex_ + lVar18),
                               (pthread_mutexattr_t *)0x0);
            pvVar8 = aom_malloc(0x30);
            *(void **)((long)&cdef_sync->cdef_row_mt->row_cond_ + lVar18) = pvVar8;
            if (*(long *)((long)&cdef_sync->cdef_row_mt->row_cond_ + lVar18) == 0) {
              aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                                 "Failed to allocate (*cdef_row_mt)[row_idx].row_cond_");
            }
            pthread_cond_init(*(pthread_cond_t **)
                               ((long)&cdef_sync->cdef_row_mt->row_cond_ + lVar18),
                              (pthread_condattr_t *)0x0);
            lVar18 = lVar18 + 0x18;
          } while ((long)iVar16 * 0x18 != lVar18);
        }
      }
    }
  }
  return;
}

Assistant:

void av1_alloc_cdef_buffers(AV1_COMMON *const cm,
                            AV1CdefWorkerData **cdef_worker,
                            AV1CdefSync *cdef_sync, int num_workers,
                            int init_worker) {
  const int num_planes = av1_num_planes(cm);
  size_t new_linebuf_size[MAX_MB_PLANE] = { 0 };
  size_t new_colbuf_size[MAX_MB_PLANE] = { 0 };
  size_t new_srcbuf_size = 0;
  CdefInfo *const cdef_info = &cm->cdef_info;
  // Check for configuration change
  const int num_mi_rows =
      (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;
  const int is_num_workers_changed =
      cdef_info->allocated_num_workers != num_workers;
  const int is_cdef_enabled =
      cm->seq_params->enable_cdef && !cm->tiles.single_tile_decoding;

  // num-bufs=3 represents ping-pong buffers for top linebuf,
  // followed by bottom linebuf.
  // ping-pong is to avoid top linebuf over-write by consecutive row.
  int num_bufs = 3;
  if (num_workers > 1)
    num_bufs = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

  if (is_cdef_enabled) {
    // Calculate src buffer size
    new_srcbuf_size = sizeof(*cdef_info->srcbuf) * CDEF_INBUF_SIZE;
    for (int plane = 0; plane < num_planes; plane++) {
      const int shift =
          plane == AOM_PLANE_Y ? 0 : cm->seq_params->subsampling_x;
      // Calculate top and bottom line buffer size
      const int luma_stride =
          ALIGN_POWER_OF_TWO(cm->mi_params.mi_cols << MI_SIZE_LOG2, 4);
      new_linebuf_size[plane] = sizeof(*cdef_info->linebuf) * num_bufs *
                                (CDEF_VBORDER << 1) * (luma_stride >> shift);
      // Calculate column buffer size
      const int block_height =
          (CDEF_BLOCKSIZE << (MI_SIZE_LOG2 - shift)) * 2 * CDEF_VBORDER;
      new_colbuf_size[plane] =
          sizeof(*cdef_info->colbuf[plane]) * block_height * CDEF_HBORDER;
    }
  }

  // Free src, line and column buffers for worker 0 in case of reallocation
  free_cdef_linebuf_conditional(cm, new_linebuf_size);
  free_cdef_bufs_conditional(cm, cdef_info->colbuf, &cdef_info->srcbuf,
                             new_colbuf_size, new_srcbuf_size);

  // The flag init_worker indicates if cdef_worker has to be allocated for the
  // frame. This is passed as 1 always from decoder. At encoder side, it is 0
  // when called for parallel frames during FPMT (where cdef_worker is shared
  // across parallel frames) and 1 otherwise.
  if (*cdef_worker != NULL && init_worker) {
    if (is_num_workers_changed) {
      // Free src and column buffers for remaining workers in case of change in
      // num_workers
      for (int idx = cdef_info->allocated_num_workers - 1; idx >= 1; idx--)
        free_cdef_bufs((*cdef_worker)[idx].colbuf, &(*cdef_worker)[idx].srcbuf);

      aom_free(*cdef_worker);
      *cdef_worker = NULL;
    } else if (num_workers > 1) {
      // Free src and column buffers for remaining workers in case of
      // reallocation
      for (int idx = num_workers - 1; idx >= 1; idx--)
        free_cdef_bufs_conditional(cm, (*cdef_worker)[idx].colbuf,
                                   &(*cdef_worker)[idx].srcbuf, new_colbuf_size,
                                   new_srcbuf_size);
    }
  }

  if (cdef_info->allocated_mi_rows != num_mi_rows)
    free_cdef_row_sync(&cdef_sync->cdef_row_mt, cdef_info->allocated_mi_rows);

  // Store allocated sizes for reallocation
  cdef_info->allocated_srcbuf_size = new_srcbuf_size;
  av1_copy(cdef_info->allocated_colbuf_size, new_colbuf_size);
  av1_copy(cdef_info->allocated_linebuf_size, new_linebuf_size);
  // Store configuration to check change in configuration
  cdef_info->allocated_mi_rows = num_mi_rows;
  cdef_info->allocated_num_workers = num_workers;

  if (!is_cdef_enabled) return;

  // Memory allocation of column buffer & source buffer (worker_0).
  alloc_cdef_bufs(cm, cdef_info->colbuf, &cdef_info->srcbuf, num_planes);
  alloc_cdef_linebuf(cm, cdef_info->linebuf, num_planes);

  if (num_workers < 2) return;

  if (init_worker) {
    if (*cdef_worker == NULL)
      CHECK_MEM_ERROR(cm, *cdef_worker,
                      aom_calloc(num_workers, sizeof(**cdef_worker)));

    // Memory allocation of column buffer & source buffer for remaining workers.
    for (int idx = num_workers - 1; idx >= 1; idx--)
      alloc_cdef_bufs(cm, (*cdef_worker)[idx].colbuf,
                      &(*cdef_worker)[idx].srcbuf, num_planes);
  }

  alloc_cdef_row_sync(cm, &cdef_sync->cdef_row_mt,
                      cdef_info->allocated_mi_rows);
}